

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

bool __thiscall
msgpack11::Value<(msgpack11::MsgPack::Type)9,_unsigned_int>::less
          (Value<(msgpack11::MsgPack::Type)9,_unsigned_int> *this,MsgPackValue *other)

{
  int iVar1;
  int iVar2;
  bool local_29;
  bool local_1b;
  bool is_less_type;
  bool is_same_type;
  MsgPackValue *other_local;
  Value<(msgpack11::MsgPack::Type)9,_unsigned_int> *this_local;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])();
  iVar2 = (*other->_vptr_MsgPackValue[3])();
  local_1b = true;
  if (iVar2 < 10) {
    local_29 = false;
    if (iVar1 == 9) {
      local_29 = this->m_value < *(uint *)&other[1]._vptr_MsgPackValue;
    }
    local_1b = local_29;
  }
  return local_1b;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        bool const is_same_type = tag == other->type();
        bool const is_less_type = tag < other->type();
        return is_less_type || (is_same_type && (m_value < static_cast<const Value<tag, T> *>(other)->m_value));
    }